

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

QString * __thiscall
QMdiSubWindowPrivate::originalWindowTitleHelper
          (QString *__return_storage_ptr__,QMdiSubWindowPrivate *this)

{
  QWidget *this_00;
  char16_t *pcVar1;
  Data *pDVar2;
  bool bVar3;
  QMdiArea *this_01;
  QWidgetPrivate *pQVar4;
  QWidget *pQVar5;
  long lVar6;
  long in_FS_OFFSET;
  QList<QMdiSubWindow_*> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  this_01 = QMdiSubWindow::mdiArea((QMdiSubWindow *)pQVar5);
  if (this_01 != (QMdiArea *)0x0) {
    QMdiArea::subWindowList(&local_50,this_01,CreationOrder);
    bVar3 = true;
    if (local_50.d.size != 0) {
      lVar6 = 0;
      do {
        this_00 = *(QWidget **)((long)local_50.d.ptr + lVar6);
        if (this_00 != pQVar5) {
          bVar3 = QWidget::isMaximized(this_00);
          if (bVar3) {
            pQVar4 = qt_widget_private(this_00);
            pcVar1 = *(char16_t **)&pQVar4[1].size_policy;
            if (pcVar1 != (char16_t *)0x0) {
              pDVar2 = *(Data **)&pQVar4[1].data.wrect.x2;
              (__return_storage_ptr__->d).d = pDVar2;
              (__return_storage_ptr__->d).ptr = pcVar1;
              (__return_storage_ptr__->d).size = (qsizetype)pQVar4[1].locale;
              if (pDVar2 != (Data *)0x0) {
                LOCK();
                (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
                UNLOCK();
              }
              bVar3 = false;
              goto LAB_00448388;
            }
          }
        }
        lVar6 = lVar6 + 8;
      } while (local_50.d.size << 3 != lVar6);
      bVar3 = true;
    }
LAB_00448388:
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,8,0x10);
      }
    }
    if (!bVar3) goto LAB_004483c3;
  }
  pQVar5 = QWidget::window(pQVar5);
  QWidget::windowTitle(__return_storage_ptr__,pQVar5);
LAB_004483c3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QMdiSubWindowPrivate::originalWindowTitleHelper() const
{
    Q_Q(const QMdiSubWindow);
    // QTBUG-92240: When DontMaximizeSubWindowOnActivation is set and
    // there is another subwindow maximized, use its original title.
    if (auto *mdiArea = q->mdiArea()) {
        const auto &subWindows = mdiArea->subWindowList();
        for (auto *subWindow : subWindows) {
            if (subWindow != q && subWindow->isMaximized()) {
                auto *subWindowD = static_cast<QMdiSubWindowPrivate *>(qt_widget_private(subWindow));
                if (!subWindowD->originalTitle.isNull())
                    return subWindowD->originalTitle;
            }
        }
    }
    return q->window()->windowTitle();
}